

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_read.c
# Opt level: O0

void rinit_io(void)

{
  uint local_c;
  uint c;
  
  printf("Init read IO system...");
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    rsheila[local_c] = s00loc;
  }
  for (local_c = 0; local_c < 8; local_c = local_c + 2) {
    rsheila[local_c] = s00loc;
    rsheila[local_c + 1] = crt_reg;
  }
  for (local_c = 8; local_c < 0x10; local_c = local_c + 2) {
    rsheila[local_c] = s02loc;
    rsheila[local_c + 1] = sFFloc;
  }
  for (local_c = 0x10; local_c < 0x18; local_c = local_c + 1) {
    rsheila[local_c] = s00loc;
  }
  for (local_c = 0x18; local_c < 0x20; local_c = local_c + 1) {
    rsheila[local_c] = sB7loc;
  }
  for (local_c = 0x20; local_c < 0x40; local_c = local_c + 1) {
    rsheila[local_c] = sFEloc;
  }
  rsheila[0x40] = sr_via_0;
  rsheila[0x50] = sr_via_0;
  rsheila[0x41] = sr_via_1;
  rsheila[0x51] = sr_via_1;
  rsheila[0x42] = sr_via_2;
  rsheila[0x52] = sr_via_2;
  rsheila[0x43] = sr_via_3;
  rsheila[0x53] = sr_via_3;
  rsheila[0x44] = sr_via_4;
  rsheila[0x54] = sr_via_4;
  rsheila[0x45] = sr_via_5;
  rsheila[0x55] = sr_via_5;
  rsheila[0x46] = sr_via_6;
  rsheila[0x56] = sr_via_6;
  rsheila[0x47] = sr_via_7;
  rsheila[0x57] = sr_via_7;
  rsheila[0x48] = sr_via_8;
  rsheila[0x58] = sr_via_8;
  rsheila[0x49] = sr_via_9;
  rsheila[0x59] = sr_via_9;
  rsheila[0x4a] = sr_via_A;
  rsheila[0x5a] = sr_via_A;
  rsheila[0x4b] = sr_via_B;
  rsheila[0x5b] = sr_via_B;
  rsheila[0x4c] = sr_via_C;
  rsheila[0x5c] = sr_via_C;
  rsheila[0x4d] = sr_via_D;
  rsheila[0x5d] = sr_via_D;
  rsheila[0x4e] = sr_via_E;
  rsheila[0x5e] = sr_via_E;
  rsheila[0x4f] = sr_via_F;
  rsheila[0x5f] = sr_via_F;
  for (local_c = 0x60; local_c < 0x80; local_c = local_c + 1) {
    rsheila[local_c] = s00loc;
  }
  for (local_c = 0x80; local_c < 0xa0; local_c = local_c + 8) {
    rsheila[local_c] = s00loc;
    rsheila[local_c + 1] = sFFloc;
    rsheila[local_c + 2] = s9Dloc;
    rsheila[local_c + 3] = sFFloc;
    rsheila[local_c + 4] = sABloc;
    rsheila[local_c + 5] = sABloc;
    rsheila[local_c + 6] = sABloc;
    rsheila[local_c + 7] = sABloc;
  }
  for (local_c = 0xa0; local_c < 0xc0; local_c = local_c + 4) {
    rsheila[local_c] = s10loc;
    rsheila[local_c + 1] = s20loc;
    rsheila[local_c + 2] = s28loc;
    rsheila[local_c + 3] = s28loc;
  }
  for (local_c = 0xc0; local_c < 0xe0; local_c = local_c + 1) {
    rsheila[local_c] = s00loc;
  }
  for (local_c = 0xe0; local_c < 0x100; local_c = local_c + 1) {
    rsheila[local_c] = sFEloc;
  }
  printf("Done\n");
  return;
}

Assistant:

void rinit_io(void) {
    unsigned int c;

    printf("Init read IO system...");    // display pretty startup status

    for (c = 0; c <= 0xFF; c++) {
        rsheila[c] = s00loc;
    }

    for (c = 0x00; c <= 0x07; c += 2) {
        rsheila[c] = s00loc;
        rsheila[c + 1] = crt_reg;
    }

    for (c = 0x08; c <= 0xF; c += 2) {
        rsheila[c] = s02loc;
        rsheila[c + 1] = sFFloc;
    }

    for (c = 0x10; c <= 0x17; c++) {
        rsheila[c] = s00loc;
    }

    for (c = 0x18; c <= 0x1F; c++) {
        rsheila[c] = sB7loc;
    }

    for (c = 0x20; c <= 0x3F; c++) {
        rsheila[c] = sFEloc;
    }

    rsheila[0x50] = rsheila[0x40] = sr_via_0;
    rsheila[0x51] = rsheila[0x41] = sr_via_1;
    rsheila[0x52] = rsheila[0x42] = sr_via_2;
    rsheila[0x53] = rsheila[0x43] = sr_via_3;
    rsheila[0x54] = rsheila[0x44] = sr_via_4;
    rsheila[0x55] = rsheila[0x45] = sr_via_5;
    rsheila[0x56] = rsheila[0x46] = sr_via_6;
    rsheila[0x57] = rsheila[0x47] = sr_via_7;
    rsheila[0x58] = rsheila[0x48] = sr_via_8;
    rsheila[0x59] = rsheila[0x49] = sr_via_9;
    rsheila[0x5A] = rsheila[0x4A] = sr_via_A;
    rsheila[0x5B] = rsheila[0x4B] = sr_via_B;
    rsheila[0x5C] = rsheila[0x4C] = sr_via_C;
    rsheila[0x5D] = rsheila[0x4D] = sr_via_D;
    rsheila[0x5E] = rsheila[0x4E] = sr_via_E;
    rsheila[0x5F] = rsheila[0x4F] = sr_via_F;


    for (c = 0x60; c <= 0x7F; c++) {
        rsheila[c] = s00loc;
    }

    for (c = 0x80; c <= 0x9F; c += 8) {
        rsheila[c + 0] = s00loc;
        rsheila[c + 1] = sFFloc;
        rsheila[c + 2] = s9Dloc;
        rsheila[c + 3] = sFFloc;
        rsheila[c + 4] = sABloc;
        rsheila[c + 5] = sABloc;
        rsheila[c + 6] = sABloc;
        rsheila[c + 7] = sABloc;
    }

    for (c = 0xA0; c <= 0xBF; c += 4) {
        rsheila[c + 0] = s10loc;
        rsheila[c + 1] = s20loc;
        rsheila[c + 2] = s28loc;
        rsheila[c + 3] = s28loc;
    }

    for (c = 0xC0; c <= 0xDF; c++) {
        rsheila[c] = s00loc;
    }

    for (c = 0xE0; c <= 0xFF; c++) {
        rsheila[c] = sFEloc;
    }

    printf("Done\n");     // display pretty startup status

}